

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

void __thiscall
deqp::sl::ShaderCase::dumpValues(ShaderCase *this,ValueBlock *valueBlock,int arrayNdx)

{
  float fVar1;
  DataType dataType;
  _Alloc_hider _Var2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ostream *poVar11;
  long lVar12;
  int iVar13;
  int colNdx;
  int iVar14;
  int iVar15;
  pointer pVVar16;
  int iVar17;
  int iVar18;
  ostringstream *this_00;
  ulong uVar19;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  string local_348 [32];
  undefined1 local_328 [384];
  ostringstream result;
  
  attribValues.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attribValues.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attribValues.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = ((long)(valueBlock->values).
                 super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(valueBlock->values).
                super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  uVar19 = 0;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar19;
  }
  do {
    if (uVar19 == uVar9) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&attribValues);
      return;
    }
    pVVar16 = (valueBlock->values).
              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_p = pVVar16[uVar19].valueName._M_dataplus._M_p;
    dataType = pVVar16[uVar19].dataType;
    iVar4 = glu::getDataTypeScalarSize(dataType);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
    std::operator<<((ostream *)&result,"    ");
    pVVar16 = pVVar16 + uVar19;
    if ((ulong)pVVar16->storageType < 3) {
      std::operator<<((ostream *)&result,
                      &DAT_017d4b44 + *(int *)(&DAT_017d4b44 + (ulong)pVVar16->storageType * 4));
    }
    pcVar10 = glu::getDataTypeName(dataType);
    poVar11 = std::operator<<((ostream *)&result,pcVar10);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,_Var2._M_p);
    std::operator<<(poVar11,":");
    uVar8 = (ulong)dataType;
    if (dataType < TYPE_BOOL_VEC2) {
      pcVar10 = " [ ";
      if ((0x77003801cU >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x888004002U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_00d6de7b;
        std::operator<<((ostream *)&result," ");
        if ((dataType < TYPE_BOOL) && (pcVar10 = " [ ", (0x77003801cU >> (uVar8 & 0x3f) & 1) != 0))
        goto LAB_00d6dbab;
        goto LAB_00d6de90;
      }
LAB_00d6dbab:
      std::operator<<((ostream *)&result,pcVar10);
    }
    else {
LAB_00d6de7b:
      pcVar10 = " [ ";
      if (dataType - TYPE_BOOL_VEC2 < 3) goto LAB_00d6dbab;
LAB_00d6de90:
      pcVar10 = "\n";
      if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) goto LAB_00d6dbab;
    }
    if (((dataType < TYPE_BOOL) && ((0x7f803c01eU >> (uVar8 & 0x3f) & 1) != 0)) ||
       (dataType - TYPE_BOOL < 4)) {
      iVar17 = 0;
      iVar14 = 0;
      if (0 < iVar4) {
        iVar17 = iVar4;
        iVar14 = 0;
      }
      for (; iVar17 != iVar14; iVar14 = iVar14 + 1) {
        iVar5 = 0;
        if (pVVar16->arrayLength != 1) {
          iVar5 = arrayNdx;
        }
        lVar3 = *(long *)&(pVVar16->elements).
                          super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                          ._M_impl.super__Vector_impl_data;
        pcVar10 = " , ";
        if (iVar14 == 0) {
          pcVar10 = glcts::fixed_sample_locations_values;
        }
        std::operator<<((ostream *)&result,(bool *)pcVar10 + 1);
        lVar12 = (long)(iVar5 * iVar4 + iVar14);
        if (dataType - TYPE_FLOAT < 4) {
          std::ostream::operator<<((ostringstream *)&result,*(float *)(lVar3 + lVar12 * 4));
        }
        else if (dataType - TYPE_INT < 4) {
          std::ostream::operator<<((ostringstream *)&result,*(int *)(lVar3 + lVar12 * 4));
        }
        else if (dataType - TYPE_BOOL < 4) {
          pcVar10 = "false";
          if (*(int *)(lVar3 + lVar12 * 4) != 0) {
            pcVar10 = "true";
          }
          std::operator<<((ostream *)&result,pcVar10);
        }
      }
    }
    else if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      iVar14 = glu::getDataTypeMatrixNumRows(dataType);
      iVar5 = glu::getDataTypeMatrixNumColumns(dataType);
      iVar13 = 0;
      iVar17 = 0;
      if (0 < iVar5) {
        iVar17 = iVar5;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
        std::operator<<((ostream *)&result,"       [ ");
        for (iVar15 = 0; iVar17 != iVar15; iVar15 = iVar15 + 1) {
          iVar6 = 0;
          if (pVVar16->arrayLength != 1) {
            iVar6 = arrayNdx;
          }
          fVar1 = *(float *)(*(long *)&(pVVar16->elements).
                                       super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                       ._M_impl.super__Vector_impl_data +
                            (long)(iVar6 * iVar4 + iVar13 + iVar15) * 4);
          pcVar10 = " , ";
          if (iVar15 == 0) {
            pcVar10 = glcts::fixed_sample_locations_values;
          }
          poVar11 = std::operator<<((ostream *)&result,(bool *)pcVar10 + 1);
          std::ostream::operator<<(poVar11,fVar1);
        }
        std::operator<<((ostream *)&result," ]\n");
        iVar13 = iVar13 + iVar5;
      }
    }
    uVar7 = dataType - TYPE_FLOAT;
    if ((uVar7 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
      pcVar10 = &DAT_017d4b50 + *(int *)(&DAT_017d4b50 + (ulong)uVar7 * 4);
LAB_00d6de07:
      std::operator<<((ostream *)&result,pcVar10);
    }
    else {
      pcVar10 = " ]\n";
      if (dataType - TYPE_BOOL_VEC2 < 3) goto LAB_00d6de07;
    }
    this_00 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,local_348);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void ShaderCase::dumpValues(const ValueBlock& valueBlock, int arrayNdx)
{
	vector<vector<float> > attribValues;

	int numValues = (int)valueBlock.values.size();
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const ShaderCase::Value& val		= valueBlock.values[valNdx];
		const char*				 valueName  = val.valueName.c_str();
		DataType				 dataType   = val.dataType;
		int						 scalarSize = getDataTypeScalarSize(val.dataType);
		ostringstream			 result;

		result << "    ";
		if (val.storageType == Value::STORAGE_INPUT)
			result << "input ";
		else if (val.storageType == Value::STORAGE_UNIFORM)
			result << "uniform ";
		else if (val.storageType == Value::STORAGE_OUTPUT)
			result << "expected ";

		result << getDataTypeName(dataType) << " " << valueName << ":";

		if (isDataTypeScalar(dataType))
			result << " ";
		if (isDataTypeVector(dataType))
			result << " [ ";
		else if (isDataTypeMatrix(dataType))
			result << "\n";

		if (isDataTypeScalarOrVector(dataType))
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				int					  elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
				const Value::Element& e		  = val.elements[elemNdx * scalarSize + scalarNdx];
				result << ((scalarNdx != 0) ? ", " : "");

				if (isDataTypeFloatOrVec(dataType))
					result << e.float32;
				else if (isDataTypeIntOrIVec(dataType))
					result << e.int32;
				else if (isDataTypeBoolOrBVec(dataType))
					result << (e.bool32 ? "true" : "false");
			}
		}
		else if (isDataTypeMatrix(dataType))
		{
			int numRows = getDataTypeMatrixNumRows(dataType);
			int numCols = getDataTypeMatrixNumColumns(dataType);
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				result << "       [ ";
				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					int   elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
					float v		  = val.elements[elemNdx * scalarSize + rowNdx * numCols + colNdx].float32;
					result << ((colNdx == 0) ? "" : ", ") << v;
				}
				result << " ]\n";
			}
		}

		if (isDataTypeScalar(dataType))
			result << "\n";
		else if (isDataTypeVector(dataType))
			result << " ]\n";

		m_testCtx.getLog() << TestLog::Message << result.str() << TestLog::EndMessage;
	}
}